

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

unsigned_long __thiscall
el::base::TypedConfigurations::unsafeGetConfigByVal<unsigned_long>
          (TypedConfigurations *this,Level level,
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,char *confName)

{
  const_iterator cVar1;
  mapped_type_conflict *pmVar2;
  _Base_ptr p_Var3;
  key_type local_10;
  Level local_c;
  
  local_c = level;
  cVar1 = utils::std::
          _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::_Select1st<std::pair<const_el::Level,_unsigned_long>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          ::find(&confMap->_M_t,&local_c);
  if ((_Rb_tree_header *)cVar1._M_node == &(confMap->_M_t)._M_impl.super__Rb_tree_header) {
    local_10 = Global;
    pmVar2 = utils::std::
             map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
             ::at(confMap,&local_10);
    p_Var3 = (_Base_ptr)*pmVar2;
  }
  else {
    p_Var3 = cVar1._M_node[1]._M_parent;
  }
  return (unsigned_long)p_Var3;
}

Assistant:

Conf_T unsafeGetConfigByVal(Level level, const std::map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::map<Level, Conf_T>::const_iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
        return Conf_T();
      }
    }
    return it->second;
  }